

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

SP __thiscall pbrt::BinaryReader::createEntity(BinaryReader *this,int typeTag)

{
  ostream *poVar1;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_33;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_34;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_35;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_36;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_39;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_41;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_42;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_43;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_44;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  SP SVar3;
  element_type *peVar4;
  vec2i *in_stack_fffffffffffffd28;
  vec2i local_1d0 [55];
  int local_14;
  
  peVar4 = in_RDI;
  switch(in_EDX) {
  case 1:
    std::make_shared<pbrt::Scene>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Scene,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Scene> *)in_RDI);
    std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x232903);
    _Var2._M_pi = extraout_RDX;
    break;
  case 2:
    std::make_shared<pbrt::Object>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Object,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Object> *)in_RDI);
    std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x232f7a);
    _Var2._M_pi = extraout_RDX_33;
    break;
  default:
    local_14 = in_EDX;
    poVar1 = std::operator<<((ostream *)&std::cerr,"unknown entity type tag ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
    poVar1 = std::operator<<(poVar1," in binary file");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::shared_ptr<pbrt::Entity>::shared_ptr((shared_ptr<pbrt::Entity> *)0x233163);
    _Var2._M_pi = extraout_RDX_44;
    peVar4 = in_RDI;
    break;
  case 4:
    std::make_shared<pbrt::Instance>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Instance,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Instance> *)in_RDI);
    std::shared_ptr<pbrt::Instance>::~shared_ptr((shared_ptr<pbrt::Instance> *)0x232f4a);
    _Var2._M_pi = extraout_RDX_32;
    break;
  case 5:
    std::make_shared<pbrt::Camera>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Camera,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Camera> *)in_RDI);
    std::shared_ptr<pbrt::Camera>::~shared_ptr((shared_ptr<pbrt::Camera> *)0x232e2a);
    _Var2._M_pi = extraout_RDX_26;
    break;
  case 6:
    math::vec2i::vec2i(local_1d0,0);
    std::make_shared<pbrt::Film,pbrt::math::vec2i>(in_stack_fffffffffffffd28);
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Film,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Film> *)in_RDI);
    std::shared_ptr<pbrt::Film>::~shared_ptr((shared_ptr<pbrt::Film> *)0x232dfa);
    _Var2._M_pi = extraout_RDX_25;
    break;
  case 7:
    std::make_shared<pbrt::Spectrum>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Spectrum,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Spectrum> *)in_RDI);
    std::shared_ptr<pbrt::Spectrum>::~shared_ptr((shared_ptr<pbrt::Spectrum> *)0x2330a6);
    _Var2._M_pi = extraout_RDX_40;
    break;
  case 8:
    std::make_shared<pbrt::Sampler>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Sampler,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Sampler> *)in_RDI);
    std::shared_ptr<pbrt::Sampler>::~shared_ptr((shared_ptr<pbrt::Sampler> *)0x2330cd);
    _Var2._M_pi = extraout_RDX_41;
    break;
  case 9:
    std::make_shared<pbrt::Integrator>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Integrator,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Integrator> *)in_RDI);
    std::shared_ptr<pbrt::Integrator>::~shared_ptr((shared_ptr<pbrt::Integrator> *)0x2330f4);
    _Var2._M_pi = extraout_RDX_42;
    break;
  case 10:
    std::make_shared<pbrt::Material>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Material,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Material> *)in_RDI);
    std::shared_ptr<pbrt::Material>::~shared_ptr((shared_ptr<pbrt::Material> *)0x232b43);
    _Var2._M_pi = extraout_RDX_11;
    break;
  case 0xb:
    std::make_shared<pbrt::DisneyMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::DisneyMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::DisneyMaterial> *)in_RDI);
    std::shared_ptr<pbrt::DisneyMaterial>::~shared_ptr((shared_ptr<pbrt::DisneyMaterial> *)0x232b73)
    ;
    _Var2._M_pi = extraout_RDX_12;
    break;
  case 0xc:
    std::make_shared<pbrt::UberMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::UberMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::UberMaterial> *)in_RDI);
    std::shared_ptr<pbrt::UberMaterial>::~shared_ptr((shared_ptr<pbrt::UberMaterial> *)0x232ba3);
    _Var2._M_pi = extraout_RDX_13;
    break;
  case 0xd:
    std::make_shared<pbrt::MixMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::MixMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::MixMaterial> *)in_RDI);
    std::shared_ptr<pbrt::MixMaterial>::~shared_ptr((shared_ptr<pbrt::MixMaterial> *)0x232bd3);
    _Var2._M_pi = extraout_RDX_14;
    break;
  case 0xe:
    std::make_shared<pbrt::GlassMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::GlassMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::GlassMaterial> *)in_RDI);
    std::shared_ptr<pbrt::GlassMaterial>::~shared_ptr((shared_ptr<pbrt::GlassMaterial> *)0x232c33);
    _Var2._M_pi = extraout_RDX_16;
    break;
  case 0xf:
    std::make_shared<pbrt::MirrorMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::MirrorMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::MirrorMaterial> *)in_RDI);
    std::shared_ptr<pbrt::MirrorMaterial>::~shared_ptr((shared_ptr<pbrt::MirrorMaterial> *)0x232c93)
    ;
    _Var2._M_pi = extraout_RDX_18;
    break;
  case 0x10:
    std::make_shared<pbrt::MatteMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::MatteMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::MatteMaterial> *)in_RDI);
    std::shared_ptr<pbrt::MatteMaterial>::~shared_ptr((shared_ptr<pbrt::MatteMaterial> *)0x232d23);
    _Var2._M_pi = extraout_RDX_21;
    break;
  case 0x11:
    std::make_shared<pbrt::SubstrateMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::SubstrateMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::SubstrateMaterial> *)in_RDI);
    std::shared_ptr<pbrt::SubstrateMaterial>::~shared_ptr
              ((shared_ptr<pbrt::SubstrateMaterial> *)0x232cc3);
    _Var2._M_pi = extraout_RDX_19;
    break;
  case 0x12:
    std::make_shared<pbrt::SubSurfaceMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::SubSurfaceMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::SubSurfaceMaterial> *)in_RDI);
    std::shared_ptr<pbrt::SubSurfaceMaterial>::~shared_ptr
              ((shared_ptr<pbrt::SubSurfaceMaterial> *)0x232cf3);
    _Var2._M_pi = extraout_RDX_20;
    break;
  case 0x13:
    std::make_shared<pbrt::FourierMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::FourierMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::FourierMaterial> *)in_RDI);
    std::shared_ptr<pbrt::FourierMaterial>::~shared_ptr
              ((shared_ptr<pbrt::FourierMaterial> *)0x232d53);
    _Var2._M_pi = extraout_RDX_22;
    break;
  case 0x14:
    std::make_shared<pbrt::MetalMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::MetalMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::MetalMaterial> *)in_RDI);
    std::shared_ptr<pbrt::MetalMaterial>::~shared_ptr((shared_ptr<pbrt::MetalMaterial> *)0x232d83);
    _Var2._M_pi = extraout_RDX_23;
    break;
  case 0x15:
    std::make_shared<pbrt::PlasticMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::PlasticMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::PlasticMaterial> *)in_RDI);
    std::shared_ptr<pbrt::PlasticMaterial>::~shared_ptr
              ((shared_ptr<pbrt::PlasticMaterial> *)0x232c63);
    _Var2._M_pi = extraout_RDX_17;
    break;
  case 0x16:
    std::make_shared<pbrt::TranslucentMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::TranslucentMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::TranslucentMaterial> *)in_RDI);
    std::shared_ptr<pbrt::TranslucentMaterial>::~shared_ptr
              ((shared_ptr<pbrt::TranslucentMaterial> *)0x232c03);
    _Var2._M_pi = extraout_RDX_15;
    break;
  case 0x17:
    std::make_shared<pbrt::HairMaterial>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::HairMaterial,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::HairMaterial> *)in_RDI);
    std::shared_ptr<pbrt::HairMaterial>::~shared_ptr((shared_ptr<pbrt::HairMaterial> *)0x232db3);
    _Var2._M_pi = extraout_RDX_24;
    break;
  case 0x1e:
    std::make_shared<pbrt::Texture>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Texture> *)in_RDI);
    std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x232933);
    _Var2._M_pi = extraout_RDX_00;
    break;
  case 0x1f:
    std::make_shared<pbrt::ImageTexture>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::ImageTexture,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::ImageTexture> *)in_RDI);
    std::shared_ptr<pbrt::ImageTexture>::~shared_ptr((shared_ptr<pbrt::ImageTexture> *)0x232963);
    _Var2._M_pi = extraout_RDX_01;
    break;
  case 0x20:
    std::make_shared<pbrt::ScaleTexture>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::ScaleTexture,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::ScaleTexture> *)in_RDI);
    std::shared_ptr<pbrt::ScaleTexture>::~shared_ptr((shared_ptr<pbrt::ScaleTexture> *)0x232993);
    _Var2._M_pi = extraout_RDX_02;
    break;
  case 0x21:
    std::make_shared<pbrt::PtexFileTexture>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::PtexFileTexture,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::PtexFileTexture> *)in_RDI);
    std::shared_ptr<pbrt::PtexFileTexture>::~shared_ptr
              ((shared_ptr<pbrt::PtexFileTexture> *)0x2329c3);
    _Var2._M_pi = extraout_RDX_03;
    break;
  case 0x22:
    std::make_shared<pbrt::ConstantTexture>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::ConstantTexture,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::ConstantTexture> *)in_RDI);
    std::shared_ptr<pbrt::ConstantTexture>::~shared_ptr
              ((shared_ptr<pbrt::ConstantTexture> *)0x2329f3);
    _Var2._M_pi = extraout_RDX_04;
    break;
  case 0x23:
    std::make_shared<pbrt::CheckerTexture>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::CheckerTexture,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::CheckerTexture> *)in_RDI);
    std::shared_ptr<pbrt::CheckerTexture>::~shared_ptr((shared_ptr<pbrt::CheckerTexture> *)0x232a23)
    ;
    _Var2._M_pi = extraout_RDX_05;
    break;
  case 0x24:
    std::make_shared<pbrt::WindyTexture>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::WindyTexture,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::WindyTexture> *)in_RDI);
    std::shared_ptr<pbrt::WindyTexture>::~shared_ptr((shared_ptr<pbrt::WindyTexture> *)0x232a53);
    _Var2._M_pi = extraout_RDX_06;
    break;
  case 0x25:
    std::make_shared<pbrt::FbmTexture>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::FbmTexture,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::FbmTexture> *)in_RDI);
    std::shared_ptr<pbrt::FbmTexture>::~shared_ptr((shared_ptr<pbrt::FbmTexture> *)0x232a83);
    _Var2._M_pi = extraout_RDX_07;
    break;
  case 0x26:
    std::make_shared<pbrt::MarbleTexture>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::MarbleTexture,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::MarbleTexture> *)in_RDI);
    std::shared_ptr<pbrt::MarbleTexture>::~shared_ptr((shared_ptr<pbrt::MarbleTexture> *)0x232ab3);
    _Var2._M_pi = extraout_RDX_08;
    break;
  case 0x27:
    std::make_shared<pbrt::MixTexture>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::MixTexture,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::MixTexture> *)in_RDI);
    std::shared_ptr<pbrt::MixTexture>::~shared_ptr((shared_ptr<pbrt::MixTexture> *)0x232ae3);
    _Var2._M_pi = extraout_RDX_09;
    break;
  case 0x28:
    std::make_shared<pbrt::WrinkledTexture>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::WrinkledTexture,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::WrinkledTexture> *)in_RDI);
    std::shared_ptr<pbrt::WrinkledTexture>::~shared_ptr
              ((shared_ptr<pbrt::WrinkledTexture> *)0x232b13);
    _Var2._M_pi = extraout_RDX_10;
    break;
  case 0x32:
    std::make_shared<pbrt::TriangleMesh>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::TriangleMesh,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::TriangleMesh> *)in_RDI);
    std::shared_ptr<pbrt::TriangleMesh>::~shared_ptr((shared_ptr<pbrt::TriangleMesh> *)0x232e5a);
    _Var2._M_pi = extraout_RDX_27;
    break;
  case 0x33:
    std::make_shared<pbrt::QuadMesh>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::QuadMesh,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::QuadMesh> *)in_RDI);
    std::shared_ptr<pbrt::QuadMesh>::~shared_ptr((shared_ptr<pbrt::QuadMesh> *)0x232e8a);
    _Var2._M_pi = extraout_RDX_28;
    break;
  case 0x34:
    std::make_shared<pbrt::Sphere>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Sphere,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Sphere> *)in_RDI);
    std::shared_ptr<pbrt::Sphere>::~shared_ptr((shared_ptr<pbrt::Sphere> *)0x232eba);
    _Var2._M_pi = extraout_RDX_29;
    break;
  case 0x35:
    std::make_shared<pbrt::Disk>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Disk,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Disk> *)in_RDI);
    std::shared_ptr<pbrt::Disk>::~shared_ptr((shared_ptr<pbrt::Disk> *)0x232eea);
    _Var2._M_pi = extraout_RDX_30;
    break;
  case 0x36:
    std::make_shared<pbrt::Curve>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Curve,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::Curve> *)in_RDI);
    std::shared_ptr<pbrt::Curve>::~shared_ptr((shared_ptr<pbrt::Curve> *)0x232f1a);
    _Var2._M_pi = extraout_RDX_31;
    break;
  case 0x3c:
    std::make_shared<pbrt::DiffuseAreaLightBB>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::DiffuseAreaLightBB,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::DiffuseAreaLightBB> *)in_RDI);
    std::shared_ptr<pbrt::DiffuseAreaLightBB>::~shared_ptr
              ((shared_ptr<pbrt::DiffuseAreaLightBB> *)0x232faa);
    _Var2._M_pi = extraout_RDX_34;
    break;
  case 0x3d:
    std::make_shared<pbrt::DiffuseAreaLightRGB>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::DiffuseAreaLightRGB,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::DiffuseAreaLightRGB> *)in_RDI);
    std::shared_ptr<pbrt::DiffuseAreaLightRGB>::~shared_ptr
              ((shared_ptr<pbrt::DiffuseAreaLightRGB> *)0x232fda);
    _Var2._M_pi = extraout_RDX_35;
    break;
  case 0x46:
    std::make_shared<pbrt::InfiniteLightSource>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::InfiniteLightSource,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::InfiniteLightSource> *)in_RDI);
    std::shared_ptr<pbrt::InfiniteLightSource>::~shared_ptr
              ((shared_ptr<pbrt::InfiniteLightSource> *)0x23300a);
    _Var2._M_pi = extraout_RDX_36;
    break;
  case 0x47:
    std::make_shared<pbrt::DistantLightSource>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::DistantLightSource,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::DistantLightSource> *)in_RDI);
    std::shared_ptr<pbrt::DistantLightSource>::~shared_ptr
              ((shared_ptr<pbrt::DistantLightSource> *)0x233031);
    _Var2._M_pi = extraout_RDX_37;
    break;
  case 0x48:
    std::make_shared<pbrt::SpotLightSource>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::SpotLightSource,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::SpotLightSource> *)in_RDI);
    std::shared_ptr<pbrt::SpotLightSource>::~shared_ptr
              ((shared_ptr<pbrt::SpotLightSource> *)0x233058);
    _Var2._M_pi = extraout_RDX_38;
    break;
  case 0x49:
    std::make_shared<pbrt::PointLightSource>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::PointLightSource,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::PointLightSource> *)in_RDI);
    std::shared_ptr<pbrt::PointLightSource>::~shared_ptr
              ((shared_ptr<pbrt::PointLightSource> *)0x23307f);
    _Var2._M_pi = extraout_RDX_39;
    break;
  case 0x50:
    std::make_shared<pbrt::PixelFilter>();
    std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::PixelFilter,void>
              ((shared_ptr<pbrt::Entity> *)peVar4,(shared_ptr<pbrt::PixelFilter> *)in_RDI);
    std::shared_ptr<pbrt::PixelFilter>::~shared_ptr((shared_ptr<pbrt::PixelFilter> *)0x233118);
    _Var2._M_pi = extraout_RDX_43;
  }
  SVar3.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  SVar3.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  return (SP)SVar3.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Entity::SP createEntity(int typeTag)
    {
      switch (typeTag) {
      case TYPE_SCENE:
        return std::make_shared<Scene>();
      case TYPE_TEXTURE:
        return std::make_shared<Texture>();
      case TYPE_IMAGE_TEXTURE:
        return std::make_shared<ImageTexture>();
      case TYPE_SCALE_TEXTURE:
        return std::make_shared<ScaleTexture>();
      case TYPE_PTEX_FILE_TEXTURE:
        return std::make_shared<PtexFileTexture>();
      case TYPE_CONSTANT_TEXTURE:
        return std::make_shared<ConstantTexture>();
      case TYPE_CHECKER_TEXTURE:
        return std::make_shared<CheckerTexture>();
      case TYPE_WINDY_TEXTURE:
        return std::make_shared<WindyTexture>();
      case TYPE_FBM_TEXTURE:
        return std::make_shared<FbmTexture>();
      case TYPE_MARBLE_TEXTURE:
        return std::make_shared<MarbleTexture>();
      case TYPE_MIX_TEXTURE:
        return std::make_shared<MixTexture>();
      case TYPE_WRINKLED_TEXTURE:
        return std::make_shared<WrinkledTexture>();
      case TYPE_MATERIAL:
        return std::make_shared<Material>();
      case TYPE_DISNEY_MATERIAL:
        return std::make_shared<DisneyMaterial>();
      case TYPE_UBER_MATERIAL:
        return std::make_shared<UberMaterial>();
      case TYPE_MIX_MATERIAL:
        return std::make_shared<MixMaterial>();
      case TYPE_TRANSLUCENT_MATERIAL:
        return std::make_shared<TranslucentMaterial>();
      case TYPE_GLASS_MATERIAL:
        return std::make_shared<GlassMaterial>();
      case TYPE_PLASTIC_MATERIAL:
        return std::make_shared<PlasticMaterial>();
      case TYPE_MIRROR_MATERIAL:
        return std::make_shared<MirrorMaterial>();
      case TYPE_SUBSTRATE_MATERIAL:
        return std::make_shared<SubstrateMaterial>();
      case TYPE_SUBSURFACE_MATERIAL:
        return std::make_shared<SubSurfaceMaterial>();
      case TYPE_MATTE_MATERIAL:
        return std::make_shared<MatteMaterial>();
      case TYPE_FOURIER_MATERIAL:
        return std::make_shared<FourierMaterial>();
      case TYPE_METAL_MATERIAL:
        return std::make_shared<MetalMaterial>();
      case TYPE_HAIR_MATERIAL:
        return std::make_shared<HairMaterial>();
      case TYPE_FILM:
        return std::make_shared<Film>(vec2i(0));
      case TYPE_CAMERA:
        return std::make_shared<Camera>();
      case TYPE_TRIANGLE_MESH:
        return std::make_shared<TriangleMesh>();
      case TYPE_QUAD_MESH:
        return std::make_shared<QuadMesh>();
      case TYPE_SPHERE:
        return std::make_shared<Sphere>();
      case TYPE_DISK:
        return std::make_shared<Disk>();
      case TYPE_CURVE:
        return std::make_shared<Curve>();
      case TYPE_INSTANCE:
        return std::make_shared<Instance>();
      case TYPE_OBJECT:
        return std::make_shared<Object>();
      case TYPE_DIFFUSE_AREALIGHT_BB:
        return std::make_shared<DiffuseAreaLightBB>();
      case TYPE_DIFFUSE_AREALIGHT_RGB:
        return std::make_shared<DiffuseAreaLightRGB>();
      case TYPE_INFINITE_LIGHT_SOURCE:
        return std::make_shared<InfiniteLightSource>();
      case TYPE_DISTANT_LIGHT_SOURCE:
        return std::make_shared<DistantLightSource>();
      case TYPE_SPOT_LIGHT_SOURCE:
        return std::make_shared<SpotLightSource>();
      case TYPE_POINT_LIGHT_SOURCE:
        return std::make_shared<PointLightSource>();
      case TYPE_SPECTRUM:
        return std::make_shared<Spectrum>();
      case TYPE_SAMPLER:
        return std::make_shared<Sampler>();
      case TYPE_INTEGRATOR:
        return std::make_shared<Integrator>();
      case TYPE_PIXEL_FILTER:
        return std::make_shared<PixelFilter>();
      default:
        std::cerr << "unknown entity type tag " << typeTag << " in binary file" << std::endl;
        return Entity::SP();
      };
    }